

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O2

void __thiscall webrtc::WavReader::WavReader(WavReader *this,string *filename)

{
  int line;
  bool bVar1;
  FILE *pFVar2;
  string *result;
  ostream *poVar3;
  WavFormat format;
  size_t bytes_per_sample;
  ReadableWavFile readable;
  FatalMessage local_180;
  
  (this->super_WavFile)._vptr_WavFile = (_func_int **)&PTR__WavReader_001d3e38;
  pFVar2 = fopen((filename->_M_dataplus)._M_p,"rb");
  this->file_handle_ = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x33);
    poVar3 = std::operator<<((ostream *)&local_180,"Check failed: file_handle_");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"# ");
    std::operator<<(poVar3,"Could not open wav file for reading.");
  }
  else {
    readable.super_ReadableWav._vptr_ReadableWav = (_func_int **)&PTR_Read_001d3ee8;
    readable.file_ = (FILE *)pFVar2;
    bVar1 = ReadWavHeader(&readable.super_ReadableWav,&this->num_channels_,&this->sample_rate_,
                          &format,&bytes_per_sample,&this->num_samples_);
    if (bVar1) {
      this->num_samples_remaining_ = this->num_samples_;
      result = rtc::CheckEQImpl<webrtc::WavFormat,webrtc::WavFormat>
                         (&kWavFormat,&format,"kWavFormat == format");
      if (result == (string *)0x0) {
        result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                           (&kBytesPerSample,&bytes_per_sample,"kBytesPerSample == bytes_per_sample"
                           );
        if (result == (string *)0x0) {
          return;
        }
        line = 0x3c;
      }
      else {
        line = 0x3b;
      }
      rtc::FatalMessage::FatalMessage
                (&local_180,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
                 ,line,result);
      rtc::FatalMessage::~FatalMessage(&local_180);
    }
    rtc::FatalMessage::FatalMessage
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x39);
    poVar3 = std::operator<<((ostream *)&local_180,
                             "Check failed: ReadWavHeader(&readable, &num_channels_, &sample_rate_, &format, &bytes_per_sample, &num_samples_)"
                            );
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<(poVar3,"# ");
  }
  rtc::FatalMessage::~FatalMessage(&local_180);
}

Assistant:

WavReader::WavReader(const std::string& filename)
    : file_handle_(fopen(filename.c_str(), "rb")) {
  RTC_CHECK(file_handle_) << "Could not open wav file for reading.";

  ReadableWavFile readable(file_handle_);
  WavFormat format;
  size_t bytes_per_sample;
  RTC_CHECK(ReadWavHeader(&readable, &num_channels_, &sample_rate_, &format,
                          &bytes_per_sample, &num_samples_));
  num_samples_remaining_ = num_samples_;
  RTC_CHECK_EQ(kWavFormat, format);
  RTC_CHECK_EQ(kBytesPerSample, bytes_per_sample);
}